

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# active.cc
# Opt level: O1

void predict_or_learn_simulation<true>(active *a,single_learner *base,example *ec)

{
  double dVar1;
  vw *pvVar2;
  shared_data *psVar3;
  float fVar4;
  float fVar5;
  
  (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20));
  pvVar2 = a->all;
  dVar1 = pvVar2->sd->t;
  fVar5 = (ec->pred).scalar;
  fVar4 = (float)(**(code **)(base + 0x50))
                           (*(undefined8 *)(base + 0x48),*(undefined8 *)(base + 0x20),ec);
  fVar4 = ABS(fVar5) / fVar4;
  ec->confidence = fVar4;
  fVar5 = query_decision(a,fVar4,(float)dVar1);
  if (0.0 < fVar5) {
    psVar3 = pvVar2->sd;
    psVar3->queries = psVar3->queries + 1;
    ec->weight = fVar5 * ec->weight;
    (**(code **)(base + 0x28))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
    return;
  }
  (ec->l).multi.label = 0x7f7fffff;
  ec->weight = 0.0;
  return;
}

Assistant:

void predict_or_learn_simulation(active& a, single_learner& base, example& ec)
{
  base.predict(ec);

  if (is_learn)
  {
    vw& all = *a.all;

    float k = (float)all.sd->t;
    float threshold = 0.f;

    ec.confidence = fabsf(ec.pred.scalar - threshold) / base.sensitivity(ec);
    float importance = query_decision(a, ec.confidence, k);

    if (importance > 0)
    {
      all.sd->queries += 1;
      ec.weight *= importance;
      base.learn(ec);
    }
    else
    {
      ec.l.simple.label = FLT_MAX;
      ec.weight = 0.f;
    }
  }
}